

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O3

int AF_A_FSwordAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AWeapon *this;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  AActor *source;
  char *__assertion;
  bool bVar6;
  FSoundID local_54;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005dd18d;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005dd17d;
  source = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_005dcef1;
    pPVar5 = (source->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (source->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar6 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar6) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar6) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005dd18d;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_005dd17d;
LAB_005dcef1:
    source = (AActor *)0x0;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_005dcfb1;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005dd17d:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005dd18d;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar5 = (PClass *)puVar2[1];
        if (pPVar5 == (PClass *)0x0) {
          pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
          puVar2[1] = pPVar5;
        }
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar6) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar6 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005dd18d;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_005dd17d;
  }
  if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005dcfb1:
    if (source->player != (player_t *)0x0) {
      this = source->player->ReadyWeapon;
      if ((this != (AWeapon *)0x0) &&
         (bVar6 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1), !bVar6)) {
        return 0;
      }
      local_30.Degrees = (source->Angles).Yaw.Degrees + 11.25;
      P_SpawnPlayerMissile
                (source,0.0,0.0,-10.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_30,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_38.Degrees = (source->Angles).Yaw.Degrees + 5.625;
      P_SpawnPlayerMissile
                (source,0.0,0.0,-5.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_38,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_40.Degrees = (source->Angles).Yaw.Degrees;
      P_SpawnPlayerMissile
                (source,0.0,0.0,0.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_40,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_48.Degrees = (source->Angles).Yaw.Degrees + -5.625;
      P_SpawnPlayerMissile
                (source,0.0,0.0,5.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_48,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_50.Degrees = (source->Angles).Yaw.Degrees + -11.25;
      P_SpawnPlayerMissile
                (source,0.0,0.0,10.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_50,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_54.ID = S_FindSound("FighterSwordFire");
      S_Sound(source,1,&local_54,1.0,1.0);
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005dd18d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x51,"int AF_A_FSwordAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FSwordAttack)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire))
			return 0;
	}
	P_SpawnPlayerMissile (self, 0, 0, -10, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw + (45./4));
	P_SpawnPlayerMissile (self, 0, 0,  -5, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw + (45./8));
	P_SpawnPlayerMissile (self, 0, 0,   0, RUNTIME_CLASS(AFSwordMissile),  self->Angles.Yaw);
	P_SpawnPlayerMissile (self, 0, 0,   5, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw - (45./8));
	P_SpawnPlayerMissile (self, 0, 0,  10, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw - (45./4));
	S_Sound (self, CHAN_WEAPON, "FighterSwordFire", 1, ATTN_NORM);
	return 0;
}